

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.cc
# Opt level: O0

bool __thiscall
features::Sift::descriptor_assignment(Sift *this,Keypoint *kp,Descriptor *desc,Octave *octave)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  const_reference pvVar5;
  ImageBase *pIVar6;
  element_type *peVar7;
  float *pfVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  double dVar13;
  float local_138;
  int local_134;
  int local_130;
  int i;
  int idx;
  int t;
  int x;
  int y;
  int ystride;
  int xstride;
  float weights [3] [2];
  int bti [2];
  int byi [2];
  int bxi [2];
  float contrib;
  float local_d8;
  float gaussian_weight;
  float gaussian_sigma;
  float bint;
  float biny;
  float binx;
  float binoff;
  float winy;
  float winx;
  float theta;
  float angle;
  float mod;
  int dx;
  int yoff;
  int dy;
  int center;
  float local_98;
  int win;
  float binsize;
  float coso;
  float sino;
  int height;
  int local_74;
  undefined1 local_70 [4];
  int width;
  ConstPtr ori;
  ConstPtr grad;
  float sigma;
  float dyf;
  float dxf;
  int is;
  int iy;
  int ix;
  int OHB;
  int PXB;
  Octave *octave_local;
  Descriptor *desc_local;
  Keypoint *kp_local;
  Sift *this_local;
  
  iVar3 = (int)(kp->x + 0.5);
  iVar4 = (int)(kp->y + 0.5);
  fVar10 = math::round<float>(&kp->sample);
  fVar1 = kp->x;
  fVar2 = kp->y;
  fVar11 = keypoint_relative_scale(this,kp);
  pvVar5 = std::
           vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
           ::operator[](&octave->grad,(long)((int)fVar10 + 1));
  this_00 = &ori.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  std::shared_ptr<core::Image<float>const>::shared_ptr<core::Image<float>,void>
            ((shared_ptr<core::Image<float>const> *)this_00,pvVar5);
  pvVar5 = std::
           vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
           ::operator[](&octave->ori,(long)((int)fVar10 + 1));
  std::shared_ptr<core::Image<float>const>::shared_ptr<core::Image<float>,void>
            ((shared_ptr<core::Image<float>const> *)local_70,pvVar5);
  pIVar6 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this_00);
  local_74 = core::ImageBase::width(pIVar6);
  pIVar6 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&ori.
                          super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  sino = (float)core::ImageBase::height(pIVar6);
  coso = 0.0;
  math::Vector<float,_128>::fill(&desc->data,&coso);
  dVar13 = std::sin((double)(ulong)(uint)desc->orientation);
  binsize = SUB84(dVar13,0);
  dVar13 = std::cos((double)(ulong)(uint)desc->orientation);
  win = SUB84(dVar13,0);
  local_98 = fVar11 * 3.0;
  center = (int)(local_98 * 1.4142135 * 5.0 * 0.5);
  if ((((iVar3 < center) || (local_74 <= iVar3 + center)) || (iVar4 < center)) ||
     ((int)sino <= iVar4 + center)) {
    this_local._7_1_ = false;
  }
  else {
    yoff = iVar4 * local_74 + iVar3;
    for (dx = -center; dx <= center; dx = dx + 1) {
      mod = (float)(dx * local_74);
      for (angle = (float)-center; (int)angle <= center; angle = (float)((int)angle + 1)) {
        peVar7 = std::
                 __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&ori.
                                  super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
        pfVar8 = core::Image<float>::at(peVar7,yoff + (int)mod + (int)angle);
        theta = *pfVar8;
        peVar7 = std::
                 __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_70);
        pfVar8 = core::Image<float>::at(peVar7,yoff + (int)mod + (int)angle);
        winx = *pfVar8;
        winy = winx - desc->orientation;
        if (winy < 0.0) {
          winy = winy + 6.2831855;
        }
        binoff = (float)(int)angle - (fVar1 - (float)iVar3);
        binx = (float)dx - (fVar2 - (float)iVar4);
        biny = 1.5;
        bint = ((float)win * binoff + binsize * binx) / local_98 + 1.5;
        gaussian_sigma = ((float)win * binx - binsize * binoff) / local_98 + 1.5;
        gaussian_weight = (winy * 8.0) / 6.2831855 + -0.5;
        local_d8 = 2.0;
        bxi[1] = (int)((bint - 1.5) * (bint - 1.5) + (gaussian_sigma - 1.5) * (gaussian_sigma - 1.5)
                      );
        fVar10 = math::gaussian_xx<float>((float *)(bxi + 1),&local_d8);
        bxi[0] = (int)(theta * fVar10);
        dVar13 = std::floor((double)(ulong)(uint)bint);
        byi[0] = (int)SUB84(dVar13,0);
        dVar13 = std::floor((double)(ulong)(uint)bint);
        byi[1] = (int)SUB84(dVar13,0) + 1;
        dVar13 = std::floor((double)(ulong)(uint)gaussian_sigma);
        bti[0] = (int)SUB84(dVar13,0);
        dVar13 = std::floor((double)(ulong)(uint)gaussian_sigma);
        bti[1] = (int)SUB84(dVar13,0) + 1;
        dVar13 = std::floor((double)(ulong)(uint)gaussian_weight);
        weights[2][1] = (float)(int)SUB84(dVar13,0);
        dVar13 = std::floor((double)(ulong)(uint)gaussian_weight);
        iVar9 = (int)SUB84(dVar13,0) + 1;
        ystride = (int)((float)byi[1] - bint);
        xstride = (int)(1.0 - ((float)byi[1] - bint));
        weights[0][0] = (float)bti[1] - gaussian_sigma;
        weights[0][1] = 1.0 - ((float)bti[1] - gaussian_sigma);
        weights[1][0] = (float)iVar9 - gaussian_weight;
        weights[1][1] = 1.0 - ((float)iVar9 - gaussian_weight);
        if ((int)weights[2][1] < 0) {
          weights[2][1] = (float)((int)weights[2][1] + 8);
        }
        y = 8;
        x = 0x20;
        for (t = 0; t < 2; t = t + 1) {
          for (idx = 0; idx < 2; idx = idx + 1) {
            for (i = 0; i < 2; i = i + 1) {
              if (((-1 < byi[idx]) && (byi[idx] < 4)) && ((-1 < bti[t] && (bti[t] < 4)))) {
                local_130 = (int)weights[2][(long)i + 1] + byi[idx] * 8 + bti[t] * 0x20;
                fVar12 = (float)bxi[0] * (float)(&ystride)[idx];
                fVar10 = weights[0][t];
                fVar11 = weights[1][i];
                pfVar8 = math::Vector<float,_128>::operator[](&desc->data,local_130);
                *pfVar8 = fVar12 * fVar10 * fVar11 + *pfVar8;
              }
            }
          }
        }
      }
    }
    math::Vector<float,_128>::normalize(&desc->data);
    for (local_134 = 0; local_134 < 0x80; local_134 = local_134 + 1) {
      pfVar8 = math::Vector<float,_128>::operator[](&desc->data,local_134);
      local_138 = 0.2;
      pfVar8 = std::min<float>(pfVar8,&local_138);
      fVar1 = *pfVar8;
      pfVar8 = math::Vector<float,_128>::operator[](&desc->data,local_134);
      *pfVar8 = fVar1;
    }
    math::Vector<float,_128>::normalize(&desc->data);
    this_local._7_1_ = true;
  }
  dy = 1;
  std::shared_ptr<const_core::Image<float>_>::~shared_ptr
            ((shared_ptr<const_core::Image<float>_> *)local_70);
  std::shared_ptr<const_core::Image<float>_>::~shared_ptr
            ((shared_ptr<const_core::Image<float>_> *)
             &ori.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return this_local._7_1_;
}

Assistant:

bool
Sift::descriptor_assignment (Keypoint const& kp, Descriptor& desc,
    Octave const* octave)
{
    /*
     * The final feature vector has size PXB * PXB * OHB.
     * The following constants should not be changed yet, as the
     * (PXB^2 * OHB = 128) element feature vector is still hard-coded.
     */
    //int const PIX = 16; // Descriptor region with 16x16 pixel
    int const PXB = 4; // Pixel bins with 4x4 bins
    int const OHB = 8; // Orientation histogram with 8 bins

    /* Integral x and y coordinates and closest scale sample. */
    int const ix = static_cast<int>(kp.x + 0.5f);
    int const iy = static_cast<int>(kp.y + 0.5f);
    int const is = static_cast<int>(math::round(kp.sample));
    float const dxf = kp.x - static_cast<float>(ix);
    float const dyf = kp.y - static_cast<float>(iy);
    float const sigma = this->keypoint_relative_scale(kp);

    /* Images with its dimension for the keypoint. */
    core::FloatImage::ConstPtr grad(octave->grad[is + 1]);
    core::FloatImage::ConstPtr ori(octave->ori[is + 1]);
    int const width = grad->width();
    int const height = grad->height();

    /* Clear feature vector. */
    desc.data.fill(0.0f);

    /* Rotation constants given by descriptor orientation. */
    float const sino = std::sin(desc.orientation);
    float const coso = std::cos(desc.orientation);

    /*
     * Compute window size.
     * Each spacial bin has an extension of 3 * sigma (sigma is the scale
     * of the keypoint). For interpolation we need another half bin at
     * both ends in each dimension. And since the window can be arbitrarily
     * rotated, we need to multiply with sqrt(2). The window size is:
     * 2W = sqrt(2) * 3 * sigma * (PXB + 1).
     */
    float const binsize = 3.0f * sigma;
    int win = MATH_SQRT2 * binsize * (float)(PXB + 1) * 0.5f;
    if (ix < win || ix + win >= width || iy < win || iy + win >= height)
        return false;

    /*
     * Iterate over the window, intersected with the image region
     * from (1,1) to (w-2, h-2) since gradients/orientations are
     * not defined at the boundary pixels. Add all samples to the
     * corresponding bin.
     */
    int const center = iy * width + ix; // Center pixel at KP location
    for (int dy = -win; dy <= win; ++dy)
    {
        int const yoff = dy * width;
        for (int dx = -win; dx <= win; ++dx)
        {
            /* Get pixel gradient magnitude and orientation. */
            float const mod = grad->at(center + yoff + dx);
            float const angle = ori->at(center + yoff + dx);
            float theta = angle - desc.orientation;
            if (theta < 0.0f)
                theta += 2.0f * MATH_PI;

            /* Compute fractional coordinates w.r.t. the window. */
            float const winx = (float)dx - dxf;
            float const winy = (float)dy - dyf;

            /*
             * Compute normalized coordinates w.r.t. bins. The window
             * coordinates are rotated around the keypoint. The bins are
             * chosen such that 0 is the coordinate of the first bins center
             * in each dimension. In other words, (0,0,0) is the coordinate
             * of the first bin center in the three dimensional histogram.
             */
            float binoff = (float)(PXB - 1) / 2.0f;
            float binx = (coso * winx + sino * winy) / binsize + binoff;
            float biny = (-sino * winx + coso * winy) / binsize + binoff;
            float bint = theta * (float)OHB / (2.0f * MATH_PI) - 0.5f;

            /* Compute circular window weight for the sample. */
            float gaussian_sigma = 0.5f * (float)PXB;
            float gaussian_weight = math::gaussian_xx
                (MATH_POW2(binx - binoff) + MATH_POW2(biny - binoff),
                gaussian_sigma);

            /* Total contribution of the sample in the histogram is now: */
            float contrib = mod * gaussian_weight;

            /*
             * Distribute values into bins (using trilinear interpolation).
             * Each sample is inserted into 8 bins. Some of these bins may
             * not exist, because the sample is outside the keypoint window.
             */
            int bxi[2] = { (int)std::floor(binx), (int)std::floor(binx) + 1 };
            int byi[2] = { (int)std::floor(biny), (int)std::floor(biny) + 1 };
            int bti[2] = { (int)std::floor(bint), (int)std::floor(bint) + 1 };

            float weights[3][2] = {
                { (float)bxi[1] - binx, 1.0f - ((float)bxi[1] - binx) },
                { (float)byi[1] - biny, 1.0f - ((float)byi[1] - biny) },
                { (float)bti[1] - bint, 1.0f - ((float)bti[1] - bint) }
            };

            // Wrap around orientation histogram
            if (bti[0] < 0)
                bti[0] += OHB;
            if (bti[1] >= OHB)
                bti[1] -= OHB;

            /* Iterate the 8 bins and add weighted contrib to each. */
            int const xstride = OHB;
            int const ystride = OHB * PXB;
            for (int y = 0; y < 2; ++y)
                for (int x = 0; x < 2; ++x)
                    for (int t = 0; t < 2; ++t)
                    {
                        if (bxi[x] < 0 || bxi[x] >= PXB
                            || byi[y] < 0 || byi[y] >= PXB)
                            continue;

                        int idx = bti[t] + bxi[x] * xstride + byi[y] * ystride;
                        desc.data[idx] += contrib * weights[0][x]
                            * weights[1][y] * weights[2][t];
                    }
        }
    }

    /* Normalize the feature vector. */
    desc.data.normalize();

    /* Truncate descriptor values to 0.2. */
    for (int i = 0; i < PXB * PXB * OHB; ++i)
        desc.data[i] = std::min(desc.data[i], 0.2f);

    /* Normalize once again. */
    desc.data.normalize();

    return true;
}